

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O3

string * __thiscall
lan::db::prepare_char_to_write_abi_cxx11_(string *__return_storage_ptr__,db *this,char src)

{
  undefined3 in_register_00000011;
  string temp;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((CONCAT31(in_register_00000011,src) == 0x5c) || (CONCAT31(in_register_00000011,src) == 0x22))
  {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string db::prepare_char_to_write(char src){
            std::string dst, temp ;
            if(src == '\"' or src == '\\') dst += "\\";
            dst += src;
            return dst;
        }